

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_string_neg(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *pgVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  _Bool _Var2;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_string_t *string;
  char local_1048 [8];
  char _buffer [4096];
  char *s;
  gravity_string_t *s1;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  pgVar1 = (args->field_1).p;
  _buffer._4088_8_ =
       string_ndup((char *)pgVar1->objclass,(ulong)*(uint *)((long)&pgVar1->identifier + 4));
  _Var2 = utf8_reverse((char *)_buffer._4088_8_);
  if (_Var2) {
    aVar3.p = (gravity_object_t *)
              gravity_string_new(vm,(char *)_buffer._4088_8_,
                                 *(uint32_t *)((long)&pgVar1->identifier + 4),
                                 *(uint32_t *)((long)&pgVar1->identifier + 4));
    value.field_1.p = (gravity_object_t *)aVar3.n;
    value.isa = (aVar3.p)->isa;
    gravity_vm_setslot(vm,value,rindex);
  }
  else {
    snprintf(local_1048,0x1000,"Unable to reverse a malformed string.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1048);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,rindex);
  }
  return _Var2;
}

Assistant:

static bool operator_string_neg (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_1VARIABLE(v1, 0);

    // reverse the string
    gravity_string_t *s1 = VALUE_AS_STRING(v1);
    char *s = (char *)string_ndup(s1->s, s1->len);
    if (!utf8_reverse(s)) RETURN_ERROR("Unable to reverse a malformed string.");

    gravity_string_t *string = gravity_string_new(vm, s, s1->len, s1->len);
    RETURN_VALUE(VALUE_FROM_OBJECT(string), rindex);
}